

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O2

bool __thiscall
DbCheckPostLower::IsCallToHelper(DbCheckPostLower *this,Instr *instr,JnHelperMethod method)

{
  Opnd *this_00;
  bool bVar1;
  HelperCallOpnd *pHVar2;
  
  if (instr->m_opcode == CALL) {
    this_00 = instr->m_prev->m_src1;
    bVar1 = false;
    if ((this_00 != (Opnd *)0x0) && (bVar1 = false, instr->m_prev->m_opcode == MOV)) {
      bVar1 = IR::Opnd::IsHelperCallOpnd(this_00);
      if (bVar1) {
        pHVar2 = IR::Opnd::AsHelperCallOpnd(this_00);
        bVar1 = pHVar2->m_fnHelper == method;
      }
      else {
        bVar1 = false;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool
DbCheckPostLower::IsCallToHelper(IR::Instr *instr, IR::JnHelperMethod method)
{
    IR::Instr *prev = instr->m_prev;
    IR::Opnd *src1 = prev->GetSrc1();
    return instr->m_opcode == Js::OpCode::CALL &&
        prev->m_opcode == Js::OpCode::MOV &&
        src1 &&
        src1->IsHelperCallOpnd() &&
        src1->AsHelperCallOpnd()->m_fnHelper == method;
}